

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CodeGeneratorRequest::CodeGeneratorRequest
          (CodeGeneratorRequest *this,CodeGeneratorRequest *from)

{
  CodeGeneratorRequest *from_local;
  CodeGeneratorRequest *this_local;
  
  Message::Message(&this->super_Message);
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__CodeGeneratorRequest_0040ebe8;
  UnknownFieldSet::UnknownFieldSet(&this->_unknown_fields_);
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField(&this->file_to_generate_);
  RepeatedPtrField<google::protobuf::FileDescriptorProto>::RepeatedPtrField(&this->proto_file_);
  SharedCtor(this);
  MergeFrom(this,from);
  return;
}

Assistant:

CodeGeneratorRequest::CodeGeneratorRequest(const CodeGeneratorRequest& from)
  : ::google::protobuf::Message() {
  SharedCtor();
  MergeFrom(from);
}